

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O3

base_learner * Search::setup(options_i *options,vw *all)

{
  uint uVar1;
  undefined4 uVar2;
  options_i *this;
  undefined *puVar3;
  search_task *psVar4;
  search_metatask *psVar5;
  ulong __val;
  _func_void_search_ptr_size_t_ptr_options_i_ptr *p_Var6;
  bool bVar7;
  undefined8 *puVar8;
  vw *all_00;
  char cVar9;
  char cVar10;
  int iVar11;
  uint uVar12;
  search *psVar13;
  search_private *psVar14;
  undefined8 **ppuVar15;
  typed_option<unsigned_long> *ptVar16;
  typed_option<float> *ptVar17;
  vw_exception *pvVar18;
  polylabel *ppVar19;
  undefined **ppuVar20;
  typed_option<unsigned_int> *ptVar21;
  base_learner *__src;
  clock_t cVar22;
  learner<Search::search,_std::vector<example_*,_std::allocator<example_*>_>_> *__dest;
  ostream *poVar23;
  ulong uVar24;
  long lVar25;
  RollMethod RVar26;
  size_t sVar27;
  options_i *poVar28;
  label_parser *plVar29;
  byte bVar30;
  byte bVar31;
  float fVar32;
  size_type __dnew_3;
  size_type __dnew;
  stringstream __msg;
  option_group_definition new_options;
  string rollout_string;
  string rollin_string;
  string task_string;
  string interpolation_string;
  string metatask_string;
  uint32_t search_trained_nb_policies;
  string search_allowed_transitions;
  string neighbor_features_string;
  undefined8 **local_720;
  undefined8 *local_718;
  undefined8 *local_710;
  undefined2 local_708;
  undefined8 *local_700;
  undefined8 local_6f8;
  undefined8 local_6f0;
  undefined2 local_6e8;
  options_i *local_6e0;
  search *local_6d8;
  uint32_t *local_6d0;
  undefined1 local_6c8 [16];
  undefined1 local_6b8 [32];
  string local_698 [64];
  bool local_658;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_640;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_630;
  size_t *local_540;
  option_group_definition local_538;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_500;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e0;
  size_t *local_4c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  float *local_498;
  float *local_490;
  float *local_488;
  vw *local_480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  uint local_434;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  undefined2 *local_3f0;
  undefined8 local_3e8;
  undefined2 local_3e0;
  undefined1 local_3de;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  undefined4 *local_210;
  undefined8 local_208;
  undefined4 local_200;
  undefined3 uStack_1fc;
  undefined1 local_1f9;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  undefined6 *local_50;
  undefined8 local_48;
  undefined6 local_40;
  undefined2 uStack_3a;
  undefined6 uStack_38;
  undefined1 local_32;
  
  bVar31 = 0;
  psVar13 = calloc_or_throw<Search::search>(1);
  local_6d8 = psVar13;
  psVar14 = calloc_or_throw<Search::search_private>(1);
  psVar13->priv = psVar14;
  local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
  local_4b8._M_string_length = 0;
  local_4b8.field_2._M_local_buf[0] = '\0';
  local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
  local_458._M_string_length = 0;
  local_458.field_2._M_local_buf[0] = '\0';
  local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
  local_478.field_2._M_allocated_capacity._0_4_ = 0x61746164;
  local_478._M_string_length = 4;
  local_478.field_2._M_local_buf[4] = '\0';
  local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
  local_410._M_string_length = 0;
  local_410.field_2._M_local_buf[0] = '\0';
  local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
  local_500.field_2._M_allocated_capacity._0_5_ = 0x705f78696d;
  local_500.field_2._M_allocated_capacity._5_3_ = 0x5f7265;
  local_500.field_2._8_5_ = 0x6574617473;
  local_500._M_string_length = 0xd;
  local_500.field_2._M_local_buf[0xd] = '\0';
  local_4e0._M_dataplus._M_p = (pointer)&local_4e0.field_2;
  local_4e0.field_2._M_allocated_capacity._0_5_ = 0x705f78696d;
  local_4e0.field_2._M_allocated_capacity._5_3_ = 0x5f7265;
  local_4e0.field_2._8_5_ = 0x6574617473;
  local_4e0._M_string_length = 0xd;
  local_4e0.field_2._M_local_buf[0xd] = '\0';
  local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
  local_430._M_string_length = 0;
  local_430.field_2._M_local_buf[0] = '\0';
  local_540 = &psVar14->A;
  psVar14->A = 1;
  local_50 = &local_40;
  local_40 = 0x686372616553;
  uStack_3a = 0x6f20;
  uStack_38 = 0x736e6f697470;
  local_48 = 0xe;
  local_32 = 0;
  local_538.m_name._M_dataplus._M_p = (pointer)&local_538.m_name.field_2;
  local_538.m_name.field_2._M_allocated_capacity._0_6_ = 0x686372616553;
  local_538.m_name.field_2._M_allocated_capacity._6_2_ = 0x6f20;
  local_538.m_name.field_2._8_6_ = 0x736e6f697470;
  local_538.m_name._M_string_length = 0xe;
  local_538.m_name.field_2._M_local_buf[0xe] = '\0';
  local_538.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_538.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_538.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_110.field_2._M_allocated_capacity._0_4_ = 0x72616573;
  local_110.field_2._M_allocated_capacity._4_2_ = 0x6863;
  local_110._M_string_length = 6;
  local_110.field_2._M_local_buf[6] = '\0';
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_6c8,&local_110,local_540);
  local_658 = true;
  local_720 = &local_710;
  local_700 = (undefined8 *)0x3f;
  local_720 = (undefined8 **)std::__cxx11::string::_M_create((ulong *)&local_720,(ulong)&local_700);
  local_710 = local_700;
  builtin_strncpy((char *)((long)local_720 + 0x2f)," id or 0",8);
  builtin_strncpy((char *)((long)local_720 + 0x37)," for LDF",8);
  local_720[4] = (undefined8 *)0x6d756d6978616d3d;
  local_720[5] = (undefined8 *)0x206e6f6974636120;
  local_720[2] = (undefined8 *)0x202c686372616573;
  local_720[3] = (undefined8 *)0x746e656d75677261;
  *local_720 = (undefined8 *)0x7261656c20657355;
  local_720[1] = (undefined8 *)0x206f7420676e696e;
  local_718 = local_700;
  *(char *)((long)local_720 + (long)local_700) = '\0';
  std::__cxx11::string::_M_assign(local_698);
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
            (&local_538,(typed_option<unsigned_long> *)local_6c8);
  if (local_720 != &local_710) {
    operator_delete(local_720);
  }
  local_6c8._0_8_ = &PTR__typed_option_002d61c8;
  if (local_630._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_630._M_pi);
  }
  if (local_640._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_640._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_6c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  local_130.field_2._M_allocated_capacity._0_7_ = 0x5f686372616573;
  local_130.field_2._7_4_ = 0x6b736174;
  local_130._M_string_length = 0xb;
  local_130.field_2._M_local_buf[0xb] = '\0';
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_6c8,&local_130,&local_4b8);
  local_658 = true;
  local_720 = &local_710;
  local_700 = (undefined8 *)0x4b;
  local_6e0 = options;
  ppuVar15 = (undefined8 **)std::__cxx11::string::_M_create((ulong *)&local_720,(ulong)&local_700);
  puVar8 = local_700;
  local_710 = local_700;
  local_720 = ppuVar15;
  memcpy(ppuVar15,"the search task (use \"--search_task list\" to get a list of available tasks)",
         0x4b);
  local_718 = puVar8;
  *(undefined1 *)((long)ppuVar15 + (long)puVar8) = 0;
  std::__cxx11::string::_M_assign(local_698);
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (&local_538,
             (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_6c8);
  if (local_720 != &local_710) {
    operator_delete(local_720);
  }
  local_6c8._0_8_ = &PTR__typed_option_002d6158;
  if (local_630._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_630._M_pi);
  }
  if (local_640._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_640._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_6c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p);
  }
  local_150.field_2._M_allocated_capacity._0_7_ = 0x5f686372616573;
  local_150.field_2._M_local_buf[7] = 'm';
  local_150.field_2._8_7_ = 0x6b736174617465;
  local_150._M_string_length = 0xf;
  local_150.field_2._M_local_buf[0xf] = '\0';
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_6c8,&local_150,&local_458);
  local_658 = true;
  local_720 = &local_710;
  local_700 = (undefined8 *)0x57;
  ppuVar15 = (undefined8 **)std::__cxx11::string::_M_create((ulong *)&local_720,(ulong)&local_700);
  puVar8 = local_700;
  local_710 = local_700;
  local_720 = ppuVar15;
  memcpy(ppuVar15,
         "the search metatask (use \"--search_metatask list\" to get a list of available metatasks)"
         ,0x57);
  local_718 = puVar8;
  *(undefined1 *)((long)ppuVar15 + (long)puVar8) = 0;
  std::__cxx11::string::_M_assign(local_698);
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (&local_538,
             (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_6c8);
  if (local_720 != &local_710) {
    operator_delete(local_720);
  }
  local_6c8._0_8_ = &PTR__typed_option_002d6158;
  if (local_630._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_630._M_pi);
  }
  if (local_640._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_640._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_6c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  local_720 = (undefined8 **)0x14;
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  local_230._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_230,(ulong)&local_720);
  local_230.field_2._M_allocated_capacity = (size_type)local_720;
  builtin_strncpy(local_230._M_dataplus._M_p,"search_interpolation",0x14);
  local_230._M_string_length = (size_type)local_720;
  local_230._M_dataplus._M_p[(long)local_720] = '\0';
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_6c8,&local_230,&local_478);
  local_658 = true;
  local_720 = &local_710;
  local_700 = (undefined8 *)0x39;
  local_720 = (undefined8 **)std::__cxx11::string::_M_create((ulong *)&local_720,(ulong)&local_700);
  local_710 = local_700;
  builtin_strncpy((char *)((long)local_720 + 0x29),"? [*data",8);
  builtin_strncpy((char *)((long)local_720 + 0x31),"|policy]",8);
  local_720[4] = (undefined8 *)0x6570706168206e6f;
  local_720[5] = (undefined8 *)0x7461642a5b203f6e;
  local_720[2] = (undefined8 *)0x746e6920646c756f;
  local_720[3] = (undefined8 *)0x6974616c6f707265;
  *local_720 = (undefined8 *)0x2074616877207461;
  local_720[1] = (undefined8 *)0x6873206c6576656c;
  local_718 = local_700;
  *(char *)((long)local_720 + (long)local_700) = '\0';
  std::__cxx11::string::_M_assign(local_698);
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (&local_538,
             (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_6c8);
  if (local_720 != &local_710) {
    operator_delete(local_720);
  }
  local_6c8._0_8_ = &PTR__typed_option_002d6158;
  if (local_630._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_630._M_pi);
  }
  if (local_640._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_640._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_6c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p);
  }
  local_170.field_2._M_allocated_capacity._0_6_ = 0x686372616573;
  local_170.field_2._M_allocated_capacity._6_2_ = 0x725f;
  local_170.field_2._8_6_ = 0x74756f6c6c6f;
  local_170._M_string_length = 0xe;
  local_170.field_2._M_local_buf[0xe] = '\0';
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_6c8,&local_170,&local_500);
  local_720 = &local_710;
  local_700 = (undefined8 *)0x5b;
  local_480 = all;
  ppuVar15 = (undefined8 **)std::__cxx11::string::_M_create((ulong *)&local_720,(ulong)&local_700);
  puVar8 = local_700;
  local_710 = local_700;
  local_720 = ppuVar15;
  memcpy(ppuVar15,
         "how should rollouts be executed?           [policy|oracle|*mix_per_state|mix_per_roll|none]"
         ,0x5b);
  local_718 = puVar8;
  *(undefined1 *)((long)ppuVar15 + (long)puVar8) = 0;
  std::__cxx11::string::_M_assign(local_698);
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (&local_538,
             (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_6c8);
  if (local_720 != &local_710) {
    operator_delete(local_720);
  }
  local_6c8._0_8_ = &PTR__typed_option_002d6158;
  if (local_630._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_630._M_pi);
  }
  if (local_640._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_640._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_6c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  local_190.field_2._M_allocated_capacity._0_5_ = 0x6372616573;
  local_190.field_2._M_allocated_capacity._5_3_ = 0x725f68;
  local_190.field_2._8_5_ = 0x6e696c6c6f;
  local_190._M_string_length = 0xd;
  local_190.field_2._M_local_buf[0xd] = '\0';
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_6c8,&local_190,&local_4e0);
  local_720 = &local_710;
  local_700 = (undefined8 *)0x56;
  ppuVar15 = (undefined8 **)std::__cxx11::string::_M_create((ulong *)&local_720,(ulong)&local_700);
  puVar8 = local_700;
  local_710 = local_700;
  local_720 = ppuVar15;
  memcpy(ppuVar15,
         "how should past trajectories be generated? [policy|oracle|*mix_per_state|mix_per_roll]",
         0x56);
  local_718 = puVar8;
  *(undefined1 *)((long)ppuVar15 + (long)puVar8) = 0;
  std::__cxx11::string::_M_assign(local_698);
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (&local_538,
             (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_6c8);
  if (local_720 != &local_710) {
    operator_delete(local_720);
  }
  local_6c8._0_8_ = &PTR__typed_option_002d6158;
  if (local_630._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_630._M_pi);
  }
  if (local_640._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_640._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_6c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p);
  }
  local_720 = (undefined8 **)0x18;
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  local_250._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_250,(ulong)&local_720);
  local_250.field_2._M_allocated_capacity = (size_type)local_720;
  builtin_strncpy(local_250._M_dataplus._M_p,"search_passes_per_policy",0x18);
  local_250._M_string_length = (size_type)local_720;
  local_250._M_dataplus._M_p[(long)local_720] = '\0';
  local_4c0 = &psVar14->passes_per_policy;
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_6c8,&local_250,local_4c0);
  ptVar16 = VW::config::typed_option<unsigned_long>::default_value
                      ((typed_option<unsigned_long> *)local_6c8,1);
  local_720 = &local_710;
  local_700 = (undefined8 *)0x48;
  ppuVar15 = (undefined8 **)std::__cxx11::string::_M_create((ulong *)&local_720,(ulong)&local_700);
  puVar8 = local_700;
  local_710 = local_700;
  local_720 = ppuVar15;
  memcpy(ppuVar15,"number of passes per policy (only valid for search_interpolation=policy)",0x48);
  local_718 = puVar8;
  *(undefined1 *)((long)ppuVar15 + (long)puVar8) = 0;
  std::__cxx11::string::_M_assign((string *)&(ptVar16->super_base_option).m_help);
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
            (&local_538,ptVar16);
  if (local_720 != &local_710) {
    operator_delete(local_720);
  }
  local_6c8._0_8_ = &PTR__typed_option_002d61c8;
  if (local_630._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_630._M_pi);
  }
  if (local_640._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_640._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_6c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p);
  }
  local_1b0.field_2._M_allocated_capacity._0_7_ = 0x5f686372616573;
  local_1b0.field_2._7_4_ = 0x61746562;
  local_1b0._M_string_length = 0xb;
  local_1b0.field_2._M_local_buf[0xb] = '\0';
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_6c8,&local_1b0,&psVar14->beta);
  ptVar17 = VW::config::typed_option<float>::default_value((typed_option<float> *)local_6c8,0.5);
  local_720 = &local_710;
  local_700 = (undefined8 *)0x4c;
  local_488 = &psVar14->beta;
  ppuVar15 = (undefined8 **)std::__cxx11::string::_M_create((ulong *)&local_720,(ulong)&local_700);
  puVar8 = local_700;
  local_710 = local_700;
  local_720 = ppuVar15;
  memcpy(ppuVar15,"interpolation rate for policies (only valid for search_interpolation=policy)",
         0x4c);
  local_718 = puVar8;
  *(undefined1 *)((long)ppuVar15 + (long)puVar8) = 0;
  std::__cxx11::string::_M_assign((string *)&(ptVar17->super_base_option).m_help);
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>(&local_538,ptVar17);
  if (local_720 != &local_710) {
    operator_delete(local_720);
  }
  local_6c8._0_8_ = &PTR__typed_option_002d6200;
  if (local_630._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_630._M_pi);
  }
  if (local_640._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_640._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_6c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p);
  }
  local_1d0.field_2._M_allocated_capacity = 0x615f686372616573;
  local_1d0.field_2._8_4_ = 0x6168706c;
  local_1d0._M_string_length = 0xc;
  local_1d0.field_2._M_local_buf[0xc] = '\0';
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_6c8,&local_1d0,&psVar14->alpha);
  ptVar17 = VW::config::typed_option<float>::default_value((typed_option<float> *)local_6c8,1e-10);
  local_720 = &local_710;
  local_700 = (undefined8 *)0x48;
  local_490 = &psVar14->alpha;
  ppuVar15 = (undefined8 **)std::__cxx11::string::_M_create((ulong *)&local_720,(ulong)&local_700);
  puVar8 = local_700;
  local_710 = local_700;
  local_720 = ppuVar15;
  memcpy(ppuVar15,"annealed beta = 1-(1-alpha)^t (only valid for search_interpolation=data)",0x48);
  local_718 = puVar8;
  *(undefined1 *)((long)ppuVar15 + (long)puVar8) = 0;
  std::__cxx11::string::_M_assign((string *)&(ptVar17->super_base_option).m_help);
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>(&local_538,ptVar17);
  if (local_720 != &local_710) {
    operator_delete(local_720);
  }
  local_6c8._0_8_ = &PTR__typed_option_002d6200;
  if (local_630._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_630._M_pi);
  }
  if (local_640._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_640._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_6c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  local_720 = (undefined8 **)0x18;
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  local_270._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_270,(ulong)&local_720);
  local_270.field_2._M_allocated_capacity = (size_type)local_720;
  builtin_strncpy(local_270._M_dataplus._M_p,"search_total_nb_policies",0x18);
  local_270._M_string_length = (size_type)local_720;
  local_270._M_dataplus._M_p[(long)local_720] = '\0';
  local_6d0 = &psVar14->total_number_of_policies;
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)local_6c8,&local_270,local_6d0);
  local_720 = &local_710;
  local_700 = (undefined8 *)0xaf;
  ppuVar15 = (undefined8 **)std::__cxx11::string::_M_create((ulong *)&local_720,(ulong)&local_700);
  puVar8 = local_700;
  local_710 = local_700;
  local_720 = ppuVar15;
  memcpy(ppuVar15,
         "if we are going to train the policies through multiple separate calls to vw, we need to specify this parameter and tell vw how many policies are eventually going to be trained"
         ,0xaf);
  local_718 = puVar8;
  *(undefined1 *)((long)ppuVar15 + (long)puVar8) = 0;
  std::__cxx11::string::_M_assign(local_698);
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
            (&local_538,(typed_option<unsigned_int> *)local_6c8);
  if (local_720 != &local_710) {
    operator_delete(local_720);
  }
  local_6c8._0_8_ = &PTR__typed_option_002d6238;
  if (local_630._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_630._M_pi);
  }
  if (local_640._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_640._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_6c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p);
  }
  local_720 = (undefined8 **)0x1a;
  local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  local_290._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_290,(ulong)&local_720);
  local_290.field_2._M_allocated_capacity = (size_type)local_720;
  builtin_strncpy(local_290._M_dataplus._M_p,"search_trained_nb_policies",0x1a);
  local_290._M_string_length = (size_type)local_720;
  local_290._M_dataplus._M_p[(long)local_720] = '\0';
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)local_6c8,&local_290,&local_434);
  local_720 = &local_710;
  local_700 = (undefined8 *)0x28;
  local_720 = (undefined8 **)std::__cxx11::string::_M_create((ulong *)&local_720,(ulong)&local_700);
  local_710 = local_700;
  local_720[2] = (undefined8 *)0x6f702064656e6961;
  local_720[3] = (undefined8 *)0x692073656963696c;
  *local_720 = (undefined8 *)0x626d756e20656874;
  local_720[1] = (undefined8 *)0x727420666f207265;
  local_720[4] = (undefined8 *)0x656c69662061206e;
  local_718 = local_700;
  *(char *)((long)local_720 + (long)local_700) = '\0';
  std::__cxx11::string::_M_assign(local_698);
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
            (&local_538,(typed_option<unsigned_int> *)local_6c8);
  if (local_720 != &local_710) {
    operator_delete(local_720);
  }
  local_6c8._0_8_ = &PTR__typed_option_002d6238;
  if (local_630._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_630._M_pi);
  }
  if (local_640._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_640._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_6c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p);
  }
  local_720 = (undefined8 **)0x1a;
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  local_2b0._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_2b0,(ulong)&local_720);
  local_2b0.field_2._M_allocated_capacity = (size_type)local_720;
  builtin_strncpy(local_2b0._M_dataplus._M_p,"search_allowed_transitions",0x1a);
  local_2b0._M_string_length = (size_type)local_720;
  local_2b0._M_dataplus._M_p[(long)local_720] = '\0';
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_6c8,&local_2b0,&local_430);
  local_720 = &local_710;
  local_700 = (undefined8 *)0x43;
  ppuVar15 = (undefined8 **)std::__cxx11::string::_M_create((ulong *)&local_720,(ulong)&local_700);
  puVar8 = local_700;
  local_710 = local_700;
  local_720 = ppuVar15;
  memcpy(ppuVar15,"read file of allowed transitions [def: all transitions are allowed]",0x43);
  local_718 = puVar8;
  *(undefined1 *)((long)ppuVar15 + (long)puVar8) = 0;
  std::__cxx11::string::_M_assign(local_698);
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (&local_538,
             (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_6c8);
  if (local_720 != &local_710) {
    operator_delete(local_720);
  }
  local_6c8._0_8_ = &PTR__typed_option_002d6158;
  if (local_630._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_630._M_pi);
  }
  if (local_640._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_640._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_6c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p);
  }
  local_720 = (undefined8 **)0x15;
  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  local_2d0._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_2d0,(ulong)&local_720);
  local_2d0.field_2._M_allocated_capacity = (size_type)local_720;
  builtin_strncpy(local_2d0._M_dataplus._M_p,"search_subsample_time",0x15);
  local_2d0._M_string_length = (size_type)local_720;
  local_2d0._M_dataplus._M_p[(long)local_720] = '\0';
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_6c8,&local_2d0,&psVar14->subsample_timesteps);
  local_720 = &local_710;
  local_700 = (undefined8 *)0xab;
  ppuVar15 = (undefined8 **)std::__cxx11::string::_M_create((ulong *)&local_720,(ulong)&local_700);
  puVar8 = local_700;
  local_710 = local_700;
  local_720 = ppuVar15;
  memcpy(ppuVar15,
         "instead of training at all timesteps, use a subset. if value in (0,1), train on a random v%. if v>=1, train on precisely v steps per example, if v<=-1, use active learning"
         ,0xab);
  local_718 = puVar8;
  *(undefined1 *)((long)ppuVar15 + (long)puVar8) = 0;
  std::__cxx11::string::_M_assign(local_698);
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>
            (&local_538,(typed_option<float> *)local_6c8);
  if (local_720 != &local_710) {
    operator_delete(local_720);
  }
  local_6c8._0_8_ = &PTR__typed_option_002d6200;
  if (local_630._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_630._M_pi);
  }
  if (local_640._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_640._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_6c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p);
  }
  local_720 = (undefined8 **)0x18;
  local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  local_2f0._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_2f0,(ulong)&local_720);
  local_2f0.field_2._M_allocated_capacity = (size_type)local_720;
  builtin_strncpy(local_2f0._M_dataplus._M_p,"search_neighbor_features",0x18);
  local_2f0._M_string_length = (size_type)local_720;
  local_2f0._M_dataplus._M_p[(long)local_720] = '\0';
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_6c8,&local_2f0,&local_410);
  local_658 = true;
  local_720 = &local_710;
  local_700 = (undefined8 *)0xb1;
  ppuVar15 = (undefined8 **)std::__cxx11::string::_M_create((ulong *)&local_720,(ulong)&local_700);
  puVar8 = local_700;
  local_710 = local_700;
  local_720 = ppuVar15;
  memcpy(ppuVar15,
         "copy features from neighboring lines. argument looks like: \'-1:a,+2\' meaning copy previous line namespace a and next next line from namespace _unnamed_, where \',\' separates them"
         ,0xb1);
  local_718 = puVar8;
  *(undefined1 *)((long)ppuVar15 + (long)puVar8) = 0;
  std::__cxx11::string::_M_assign(local_698);
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (&local_538,
             (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_6c8);
  if (local_720 != &local_710) {
    operator_delete(local_720);
  }
  local_6c8._0_8_ = &PTR__typed_option_002d6158;
  if (local_630._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_630._M_pi);
  }
  if (local_640._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_640._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_6c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p);
  }
  local_720 = (undefined8 **)0x18;
  local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
  local_310._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_310,(ulong)&local_720);
  local_310.field_2._M_allocated_capacity = (size_type)local_720;
  builtin_strncpy(local_310._M_dataplus._M_p,"search_rollout_num_steps",0x18);
  local_310._M_string_length = (size_type)local_720;
  local_310._M_dataplus._M_p[(long)local_720] = '\0';
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_6c8,&local_310,&psVar14->rollout_num_steps);
  local_720 = &local_710;
  local_700 = (undefined8 *)0x75;
  ppuVar15 = (undefined8 **)std::__cxx11::string::_M_create((ulong *)&local_720,(ulong)&local_700);
  puVar8 = local_700;
  local_710 = local_700;
  local_720 = ppuVar15;
  memcpy(ppuVar15,
         "how many calls of \"loss\" before we stop really predicting on rollouts and switch to oracle (default means \"infinite\")"
         ,0x75);
  local_718 = puVar8;
  *(undefined1 *)((long)ppuVar15 + (long)puVar8) = 0;
  std::__cxx11::string::_M_assign(local_698);
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
            (&local_538,(typed_option<unsigned_long> *)local_6c8);
  if (local_720 != &local_710) {
    operator_delete(local_720);
  }
  local_6c8._0_8_ = &PTR__typed_option_002d61c8;
  if (local_630._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_630._M_pi);
  }
  if (local_640._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_640._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_6c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p);
  }
  local_720 = (undefined8 **)0x15;
  local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
  local_330._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_330,(ulong)&local_720);
  local_330.field_2._M_allocated_capacity = (size_type)local_720;
  builtin_strncpy(local_330._M_dataplus._M_p,"search_history_length",0x15);
  local_330._M_string_length = (size_type)local_720;
  local_330._M_dataplus._M_p[(long)local_720] = '\0';
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_6c8,&local_330,&psVar14->history_length);
  local_658 = true;
  ptVar16 = VW::config::typed_option<unsigned_long>::default_value
                      ((typed_option<unsigned_long> *)local_6c8,1);
  local_720 = &local_710;
  local_700 = (undefined8 *)0x53;
  ppuVar15 = (undefined8 **)std::__cxx11::string::_M_create((ulong *)&local_720,(ulong)&local_700);
  puVar8 = local_700;
  local_710 = local_700;
  local_720 = ppuVar15;
  memcpy(ppuVar15,
         "some tasks allow you to specify how much history their depend on; specify that here",0x53)
  ;
  local_718 = puVar8;
  *(undefined1 *)((long)ppuVar15 + (long)puVar8) = 0;
  std::__cxx11::string::_M_assign((string *)&(ptVar16->super_base_option).m_help);
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
            (&local_538,ptVar16);
  if (local_720 != &local_710) {
    operator_delete(local_720);
  }
  local_6c8._0_8_ = &PTR__typed_option_002d61c8;
  if (local_630._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_630._M_pi);
  }
  if (local_640._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_640._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_6c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != &local_330.field_2) {
    operator_delete(local_330._M_dataplus._M_p);
  }
  local_720 = (undefined8 **)0x11;
  local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
  local_350._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_350,(ulong)&local_720);
  local_350.field_2._M_allocated_capacity = (size_type)local_720;
  builtin_strncpy(local_350._M_dataplus._M_p,"search_no_caching",0x11);
  local_350._M_string_length = (size_type)local_720;
  local_350._M_dataplus._M_p[(long)local_720] = '\0';
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_6c8,&local_350,&psVar14->no_caching);
  local_720 = &local_710;
  local_700 = (undefined8 *)0x56;
  ppuVar15 = (undefined8 **)std::__cxx11::string::_M_create((ulong *)&local_720,(ulong)&local_700);
  puVar8 = local_700;
  local_710 = local_700;
  local_720 = ppuVar15;
  memcpy(ppuVar15,
         "turn off the built-in caching ability (makes things slower, but technically more safe)",
         0x56);
  local_718 = puVar8;
  *(undefined1 *)((long)ppuVar15 + (long)puVar8) = 0;
  std::__cxx11::string::_M_assign(local_698);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (&local_538,(typed_option<bool> *)local_6c8);
  if (local_720 != &local_710) {
    operator_delete(local_720);
  }
  local_6c8._0_8_ = &PTR__typed_option_002d60f0;
  if (local_630._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_630._M_pi);
  }
  if (local_640._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_640._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_6c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_dataplus._M_p != &local_350.field_2) {
    operator_delete(local_350._M_dataplus._M_p);
  }
  local_1f0.field_2._M_allocated_capacity = 0x785f686372616573;
  local_1f0.field_2._8_2_ = 0x76;
  local_1f0._M_string_length = 9;
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_6c8,&local_1f0,&psVar14->xv);
  local_720 = &local_710;
  local_700 = (undefined8 *)0x3c;
  local_720 = (undefined8 **)std::__cxx11::string::_M_create((ulong *)&local_720,(ulong)&local_700);
  local_710 = local_700;
  builtin_strncpy((char *)((long)local_720 + 0x2c),"diction/",8);
  builtin_strncpy((char *)((long)local_720 + 0x34),"learning",8);
  local_720[4] = (undefined8 *)0x676e6974616e7265;
  local_720[5] = (undefined8 *)0x7463696465727020;
  local_720[2] = (undefined8 *)0x63696c6f70206574;
  local_720[3] = (undefined8 *)0x746c61202c736569;
  *local_720 = (undefined8 *)0x7774206e69617274;
  local_720[1] = (undefined8 *)0x617261706573206f;
  local_718 = local_700;
  *(char *)((long)local_720 + (long)local_700) = '\0';
  std::__cxx11::string::_M_assign(local_698);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (&local_538,(typed_option<bool> *)local_6c8);
  if (local_720 != &local_710) {
    operator_delete(local_720);
  }
  local_6c8._0_8_ = &PTR__typed_option_002d60f0;
  if (local_630._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_630._M_pi);
  }
  if (local_640._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_640._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_6c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p);
  }
  local_720 = (undefined8 **)0x15;
  local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
  local_370._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_370,(ulong)&local_720);
  local_370.field_2._M_allocated_capacity = (size_type)local_720;
  builtin_strncpy(local_370._M_dataplus._M_p,"search_perturb_oracle",0x15);
  local_370._M_string_length = (size_type)local_720;
  local_370._M_dataplus._M_p[(long)local_720] = '\0';
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_6c8,&local_370,&psVar14->perturb_oracle);
  ptVar17 = VW::config::typed_option<float>::default_value((typed_option<float> *)local_6c8,0.0);
  local_720 = &local_710;
  local_700 = (undefined8 *)0x32;
  local_720 = (undefined8 **)std::__cxx11::string::_M_create((ulong *)&local_720,(ulong)&local_700);
  local_710 = local_700;
  local_720[4] = (undefined8 *)0x7020736968742068;
  local_720[5] = (undefined8 *)0x696c696261626f72;
  local_720[2] = (undefined8 *)0x6f72206e6f20656c;
  local_720[3] = (undefined8 *)0x746977206e696c6c;
  *local_720 = (undefined8 *)0x2062727574726570;
  local_720[1] = (undefined8 *)0x6361726f20656874;
  *(undefined2 *)(local_720 + 6) = 0x7974;
  local_718 = local_700;
  *(char *)((long)local_720 + (long)local_700) = '\0';
  std::__cxx11::string::_M_assign((string *)&(ptVar17->super_base_option).m_help);
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>(&local_538,ptVar17);
  if (local_720 != &local_710) {
    operator_delete(local_720);
  }
  local_6c8._0_8_ = &PTR__typed_option_002d6200;
  if (local_630._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_630._M_pi);
  }
  if (local_640._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_640._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_6c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370._M_dataplus._M_p != &local_370.field_2) {
    operator_delete(local_370._M_dataplus._M_p);
  }
  local_720 = (undefined8 **)0x16;
  local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
  local_390._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_390,(ulong)&local_720);
  local_390.field_2._M_allocated_capacity = (size_type)local_720;
  builtin_strncpy(local_390._M_dataplus._M_p,"search_linear_ordering",0x16);
  local_390._M_string_length = (size_type)local_720;
  local_390._M_dataplus._M_p[(long)local_720] = '\0';
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_6c8,&local_390,&psVar14->linear_ordering);
  local_720 = &local_710;
  local_700 = (undefined8 *)0x47;
  ppuVar15 = (undefined8 **)std::__cxx11::string::_M_create((ulong *)&local_720,(ulong)&local_700);
  puVar8 = local_700;
  local_710 = local_700;
  local_720 = ppuVar15;
  memcpy(ppuVar15,"insist on generating examples in linear order (def: hoopla permutation)",0x47);
  local_718 = puVar8;
  *(undefined1 *)((long)ppuVar15 + (long)puVar8) = 0;
  std::__cxx11::string::_M_assign(local_698);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (&local_538,(typed_option<bool> *)local_6c8);
  if (local_720 != &local_710) {
    operator_delete(local_720);
  }
  local_6c8._0_8_ = &PTR__typed_option_002d60f0;
  if (local_630._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_630._M_pi);
  }
  if (local_640._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_640._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_6c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != &local_390.field_2) {
    operator_delete(local_390._M_dataplus._M_p);
  }
  local_720 = (undefined8 **)0x14;
  local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
  local_3b0._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_3b0,(ulong)&local_720);
  poVar28 = local_6e0;
  local_3b0.field_2._M_allocated_capacity = (size_type)local_720;
  builtin_strncpy(local_3b0._M_dataplus._M_p,"search_active_verify",0x14);
  local_3b0._M_string_length = (size_type)local_720;
  local_3b0._M_dataplus._M_p[(long)local_720] = '\0';
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_6c8,&local_3b0,&psVar14->active_csoaa_verify);
  local_720 = &local_710;
  local_700 = (undefined8 *)0x69;
  local_498 = &psVar14->active_csoaa_verify;
  ppuVar15 = (undefined8 **)std::__cxx11::string::_M_create((ulong *)&local_720,(ulong)&local_700);
  puVar8 = local_700;
  local_710 = local_700;
  local_720 = ppuVar15;
  memcpy(ppuVar15,
         "verify that active learning is doing the right thing (arg = multiplier, should be = cost_range * range_c)"
         ,0x69);
  local_718 = puVar8;
  *(undefined1 *)((long)ppuVar15 + (long)puVar8) = 0;
  std::__cxx11::string::_M_assign(local_698);
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>
            (&local_538,(typed_option<float> *)local_6c8);
  all_00 = local_480;
  psVar13 = local_6d8;
  if (local_720 != &local_710) {
    operator_delete(local_720);
  }
  local_6c8._0_8_ = &PTR__typed_option_002d6200;
  if (local_630._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_630._M_pi);
  }
  if (local_640._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_640._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_6c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
    operator_delete(local_3b0._M_dataplus._M_p);
  }
  local_720 = (undefined8 **)0x18;
  local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
  local_3d0._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_3d0,(ulong)&local_720);
  local_3d0.field_2._M_allocated_capacity = (size_type)local_720;
  builtin_strncpy(local_3d0._M_dataplus._M_p,"search_save_every_k_runs",0x18);
  local_3d0._M_string_length = (size_type)local_720;
  local_3d0._M_dataplus._M_p[(long)local_720] = '\0';
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_6c8,&local_3d0,&psVar14->save_every_k_runs);
  local_720 = &local_710;
  local_700 = (undefined8 *)0x17;
  local_720 = (undefined8 **)std::__cxx11::string::_M_create((ulong *)&local_720,(ulong)&local_700);
  local_710 = local_700;
  *local_720 = (undefined8 *)0x646f6d2065766173;
  local_720[1] = (undefined8 *)0x7972657665206c65;
  builtin_strncpy((char *)((long)local_720 + 0xf),"y k runs",8);
  local_718 = local_700;
  *(char *)((long)local_720 + (long)local_700) = '\0';
  std::__cxx11::string::_M_assign(local_698);
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
            (&local_538,(typed_option<unsigned_long> *)local_6c8);
  if (local_720 != &local_710) {
    operator_delete(local_720);
  }
  local_6c8._0_8_ = &PTR__typed_option_002d61c8;
  if (local_630._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_630._M_pi);
  }
  if (local_640._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_640._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_6c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p);
  }
  (**poVar28->_vptr_options_i)(poVar28,&local_538);
  local_6b8._0_2_ = 0x6573;
  local_6b8[2] = 'a';
  local_6b8[3] = 'r';
  local_6b8[4] = 'c';
  local_6b8[5] = 'h';
  local_6b8[6] = '_';
  local_6b8[7] = 't';
  local_6b8._8_2_ = 0x7361;
  local_6b8[10] = 'k';
  local_6c8._8_8_ = (undefined8 **)0xb;
  local_6b8[0xb] = '\0';
  local_6c8._0_8_ = local_6b8;
  iVar11 = (*poVar28->_vptr_options_i[1])(poVar28,local_6c8);
  if ((undefined1 *)local_6c8._0_8_ != local_6b8) {
    operator_delete((void *)local_6c8._0_8_);
  }
  if ((char)iVar11 == '\0') {
    __dest = (learner<Search::search,_std::vector<example_*,_std::allocator<example_*>_>_> *)0x0;
LAB_0025ed95:
    std::
    vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
    ::~vector(&local_538.m_options);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_538.m_name._M_dataplus._M_p != &local_538.m_name.field_2) {
      operator_delete(local_538.m_name._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430._M_dataplus._M_p != &local_430.field_2) {
      operator_delete(local_430._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
      operator_delete(local_4e0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_500._M_dataplus._M_p != &local_500.field_2) {
      operator_delete(local_500._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410._M_dataplus._M_p != &local_410.field_2) {
      operator_delete(local_410._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_478._M_dataplus._M_p != &local_478.field_2) {
      operator_delete(local_478._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_458._M_dataplus._M_p != &local_458.field_2) {
      operator_delete(local_458._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
      operator_delete(local_4b8._M_dataplus._M_p);
    }
    if (psVar13 != (search *)0x0) {
      free(psVar13->priv);
      free(psVar13);
    }
    return (base_learner *)__dest;
  }
  search_initialize(all_00,psVar13);
  parse_neighbor_features(&local_410,psVar13);
  iVar11 = std::__cxx11::string::compare((char *)&local_478);
  if (iVar11 == 0) {
    psVar14->allow_current_policy = true;
    psVar14->adaptive_beta = true;
    psVar14->passes_per_policy = all_00->numpasses;
    if (1 < psVar14->current_policy) {
      psVar14->current_policy = 1;
    }
  }
  else {
    iVar11 = std::__cxx11::string::compare((char *)&local_478);
    if (iVar11 != 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_6c8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_6b8,"error: --search_interpolation must be \'data\' or \'policy\'"
                 ,0x38);
      pvVar18 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar18,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/search.cc"
                 ,0xac5,&local_70);
      __cxa_throw(pvVar18,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
  }
  iVar11 = std::__cxx11::string::compare((char *)&local_500);
  if ((iVar11 == 0) || (iVar11 = std::__cxx11::string::compare((char *)&local_500), iVar11 == 0)) {
    psVar14->rollout_method = POLICY;
  }
  else {
    iVar11 = std::__cxx11::string::compare((char *)&local_500);
    if ((iVar11 == 0) || (iVar11 = std::__cxx11::string::compare((char *)&local_500), iVar11 == 0))
    {
      psVar14->rollout_method = ORACLE;
    }
    else {
      iVar11 = std::__cxx11::string::compare((char *)&local_500);
      if (iVar11 == 0) {
        psVar14->rollout_method = MIX_PER_STATE;
      }
      else {
        iVar11 = std::__cxx11::string::compare((char *)&local_500);
        if ((iVar11 == 0) ||
           (iVar11 = std::__cxx11::string::compare((char *)&local_500), iVar11 == 0)) {
          psVar14->rollout_method = MIX_PER_ROLL;
        }
        else {
          iVar11 = std::__cxx11::string::compare((char *)&local_500);
          if (iVar11 != 0) {
            std::__cxx11::stringstream::stringstream((stringstream *)local_6c8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_6b8,
                       "error: --search_rollout must be \'learn\', \'ref\', \'mix\', \'mix_per_state\' or \'none\'"
                       ,0x50);
            pvVar18 = (vw_exception *)__cxa_allocate_exception(0x38);
            std::__cxx11::stringbuf::str();
            VW::vw_exception::vw_exception
                      (pvVar18,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/search.cc"
                       ,0xad5,&local_90);
            __cxa_throw(pvVar18,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
          }
          psVar14->rollout_method = NO_ROLLOUT;
          psVar14->no_caching = true;
        }
      }
    }
  }
  iVar11 = std::__cxx11::string::compare((char *)&local_4e0);
  RVar26 = POLICY;
  if ((iVar11 != 0) && (iVar11 = std::__cxx11::string::compare((char *)&local_4e0), iVar11 != 0)) {
    iVar11 = std::__cxx11::string::compare((char *)&local_4e0);
    RVar26 = ORACLE;
    if ((iVar11 != 0) && (iVar11 = std::__cxx11::string::compare((char *)&local_4e0), iVar11 != 0))
    {
      iVar11 = std::__cxx11::string::compare((char *)&local_4e0);
      if (iVar11 == 0) {
        RVar26 = MIX_PER_STATE;
      }
      else {
        iVar11 = std::__cxx11::string::compare((char *)&local_4e0);
        RVar26 = MIX_PER_ROLL;
        if ((iVar11 != 0) &&
           (iVar11 = std::__cxx11::string::compare((char *)&local_4e0), iVar11 != 0)) {
          std::__cxx11::stringstream::stringstream((stringstream *)local_6c8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_6b8,
                     "error: --search_rollin must be \'learn\', \'ref\', \'mix\' or \'mix_per_state\'"
                     ,0x47);
          pvVar18 = (vw_exception *)__cxa_allocate_exception(0x38);
          std::__cxx11::stringbuf::str();
          VW::vw_exception::vw_exception
                    (pvVar18,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/search.cc"
                     ,0xae0,&local_b0);
          __cxa_throw(pvVar18,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
        }
      }
    }
  }
  psVar14->rollin_method = RVar26;
  ppVar19 = calloc_or_throw<polylabel>(1);
  psVar14->allowed_actions_cache = ppVar19;
  local_6b8._0_2_ = 0x6263;
  local_6c8._8_8_ = (pointer)0x2;
  local_6b8[2] = '\0';
  local_6c8._0_8_ = local_6b8;
  iVar11 = (*poVar28->_vptr_options_i[1])(poVar28);
  if ((undefined1 *)local_6c8._0_8_ != local_6b8) {
    operator_delete((void *)local_6c8._0_8_);
  }
  psVar14->cb_learner = SUB41(iVar11,0);
  if (SUB41(iVar11,0) == false) {
    ppuVar20 = &COST_SENSITIVE::cs_label;
  }
  else {
    ppuVar20 = &CB::cb_label;
  }
  (*(code *)*ppuVar20)(psVar14->allowed_actions_cache);
  (psVar14->learn_losses).cs.costs.end_array = (wclass *)0x0;
  (psVar14->learn_losses).cs.costs.erase_count = 0;
  (psVar14->learn_losses).cs.costs._begin = (wclass *)0x0;
  (psVar14->learn_losses).cs.costs._end = (wclass *)0x0;
  (psVar14->gte_label).cs.costs._begin = (wclass *)0x0;
  (psVar14->gte_label).cs.costs._end = (wclass *)0x0;
  (psVar14->gte_label).cs.costs.end_array = (wclass *)0x0;
  (psVar14->gte_label).cs.costs.erase_count = 0;
  ensure_param(local_488,0.0,1.0,0.5,"warning: search_beta must be in (0,1); resetting to 0.5");
  ensure_param(local_490,0.0,1.0,1e-10,"warning: search_alpha must be in (0,1); resetting to 1e-10")
  ;
  psVar14->num_calls_to_run = 0;
  uVar1 = psVar14->current_policy;
  uVar12 = uVar1;
  if (all_00->training == true) {
    fVar32 = ceilf((float)all_00->numpasses / (float)*local_4c0);
    uVar12 = (int)fVar32 + uVar1;
  }
  if ((*local_6d0 < uVar12) && (*local_6d0 = uVar12, uVar1 != 0)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "warning: you\'re attempting to train more classifiers than was allocated initially. Likely to cause bad performance."
               ,0x73);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
  }
  if ((all_00->training == false) && (psVar14->current_policy != 0)) {
    psVar14->current_policy = psVar14->current_policy - 1;
  }
  poVar28 = all_00->options;
  local_720 = (undefined8 **)0x1a;
  local_6c8._0_8_ = local_6b8;
  local_6c8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_6c8,(ulong)&local_720);
  local_6b8._0_2_ = SUB82(local_720,0);
  local_6b8[2] = (undefined1)((ulong)local_720 >> 0x10);
  local_6b8[3] = (undefined1)((ulong)local_720 >> 0x18);
  local_6b8[4] = (undefined1)((ulong)local_720 >> 0x20);
  local_6b8[5] = (undefined1)((ulong)local_720 >> 0x28);
  local_6b8[6] = (undefined1)((ulong)local_720 >> 0x30);
  local_6b8[7] = (undefined1)((ulong)local_720 >> 0x38);
  builtin_strncpy((char *)(local_6c8._0_8_ + 10),"ined_nb_",8);
  builtin_strncpy((char *)(local_6c8._0_8_ + 0x12),"policies",8);
  *(undefined8 *)local_6c8._0_8_ = 0x745f686372616573;
  *(undefined8 *)(local_6c8._0_8_ + 8) = 0x6e5f64656e696172;
  local_6c8._8_8_ = local_720;
  *(char *)(local_6c8._0_8_ + (long)local_720) = '\0';
  uVar1 = psVar14->current_policy;
  cVar10 = '\x01';
  if (9 < uVar1) {
    uVar12 = uVar1;
    cVar9 = '\x04';
    do {
      cVar10 = cVar9;
      if (uVar12 < 100) {
        cVar10 = cVar10 + -2;
        goto LAB_0025e436;
      }
      if (uVar12 < 1000) {
        cVar10 = cVar10 + -1;
        goto LAB_0025e436;
      }
      if (uVar12 < 10000) goto LAB_0025e436;
      bVar7 = 99999 < uVar12;
      uVar12 = uVar12 / 10000;
      cVar9 = cVar10 + '\x04';
    } while (bVar7);
    cVar10 = cVar10 + '\x01';
  }
LAB_0025e436:
  local_720 = &local_710;
  std::__cxx11::string::_M_construct((ulong)&local_720,cVar10);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_720,(uint)local_718,uVar1);
  (*poVar28->_vptr_options_i[6])(poVar28,local_6c8,&local_720);
  if (local_720 != &local_710) {
    operator_delete(local_720);
  }
  if ((undefined1 *)local_6c8._0_8_ != local_6b8) {
    operator_delete((void *)local_6c8._0_8_);
  }
  poVar28 = all_00->options;
  local_720 = (undefined8 **)0x1a;
  local_6c8._0_8_ = local_6b8;
  local_6c8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_6c8,(ulong)&local_720);
  local_6b8._0_2_ = SUB82(local_720,0);
  local_6b8[2] = (undefined1)((ulong)local_720 >> 0x10);
  local_6b8[3] = (undefined1)((ulong)local_720 >> 0x18);
  local_6b8[4] = (undefined1)((ulong)local_720 >> 0x20);
  local_6b8[5] = (undefined1)((ulong)local_720 >> 0x28);
  local_6b8[6] = (undefined1)((ulong)local_720 >> 0x30);
  local_6b8[7] = (undefined1)((ulong)local_720 >> 0x38);
  builtin_strncpy((char *)(local_6c8._0_8_ + 10),"ined_nb_",8);
  builtin_strncpy((char *)(local_6c8._0_8_ + 0x12),"policies",8);
  *(undefined8 *)local_6c8._0_8_ = 0x745f686372616573;
  *(undefined8 *)(local_6c8._0_8_ + 8) = 0x6e5f64656e696172;
  local_6c8._8_8_ = local_720;
  *(char *)(local_6c8._0_8_ + (long)local_720) = '\0';
  ptVar21 = VW::config::options_i::get_typed_option<unsigned_int>(poVar28,(string *)local_6c8);
  VW::config::typed_option<unsigned_int>::value(ptVar21,psVar14->current_policy);
  if ((undefined1 *)local_6c8._0_8_ != local_6b8) {
    operator_delete((void *)local_6c8._0_8_);
  }
  poVar28 = all_00->options;
  local_720 = (undefined8 **)0x18;
  local_6c8._0_8_ = local_6b8;
  local_6c8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_6c8,(ulong)&local_720);
  local_6b8._0_2_ = SUB82(local_720,0);
  local_6b8[2] = (undefined1)((ulong)local_720 >> 0x10);
  local_6b8[3] = (undefined1)((ulong)local_720 >> 0x18);
  local_6b8[4] = (undefined1)((ulong)local_720 >> 0x20);
  local_6b8[5] = (undefined1)((ulong)local_720 >> 0x28);
  local_6b8[6] = (undefined1)((ulong)local_720 >> 0x30);
  local_6b8[7] = (undefined1)((ulong)local_720 >> 0x38);
  *(undefined8 *)local_6c8._0_8_ = 0x745f686372616573;
  *(undefined8 *)(local_6c8._0_8_ + 8) = 0x5f626e5f6c61746f;
  *(_func_int **)(local_6c8._0_8_ + 0x10) = (_func_int *)0x73656963696c6f70;
  local_6c8._8_8_ = local_720;
  *(char *)(local_6c8._0_8_ + (long)local_720) = '\0';
  uVar1 = *local_6d0;
  cVar10 = '\x01';
  if (9 < uVar1) {
    uVar12 = uVar1;
    cVar9 = '\x04';
    do {
      cVar10 = cVar9;
      if (uVar12 < 100) {
        cVar10 = cVar10 + -2;
        goto LAB_0025e5b9;
      }
      if (uVar12 < 1000) {
        cVar10 = cVar10 + -1;
        goto LAB_0025e5b9;
      }
      if (uVar12 < 10000) goto LAB_0025e5b9;
      bVar7 = 99999 < uVar12;
      uVar12 = uVar12 / 10000;
      cVar9 = cVar10 + '\x04';
    } while (bVar7);
    cVar10 = cVar10 + '\x01';
  }
LAB_0025e5b9:
  local_720 = &local_710;
  std::__cxx11::string::_M_construct((ulong)&local_720,cVar10);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_720,(uint)local_718,uVar1);
  (*poVar28->_vptr_options_i[6])(poVar28,local_6c8,&local_720);
  poVar28 = local_6e0;
  if (local_720 != &local_710) {
    operator_delete(local_720);
  }
  if ((undefined1 *)local_6c8._0_8_ != local_6b8) {
    operator_delete((void *)local_6c8._0_8_);
  }
  this = all_00->options;
  local_720 = (undefined8 **)0x18;
  local_6c8._0_8_ = local_6b8;
  local_6c8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_6c8,(ulong)&local_720);
  local_6b8._0_2_ = SUB82(local_720,0);
  local_6b8[2] = (undefined1)((ulong)local_720 >> 0x10);
  local_6b8[3] = (undefined1)((ulong)local_720 >> 0x18);
  local_6b8[4] = (undefined1)((ulong)local_720 >> 0x20);
  local_6b8[5] = (undefined1)((ulong)local_720 >> 0x28);
  local_6b8[6] = (undefined1)((ulong)local_720 >> 0x30);
  local_6b8[7] = (undefined1)((ulong)local_720 >> 0x38);
  *(undefined8 *)local_6c8._0_8_ = 0x745f686372616573;
  *(undefined8 *)(local_6c8._0_8_ + 8) = 0x5f626e5f6c61746f;
  *(_func_int **)(local_6c8._0_8_ + 0x10) = (_func_int *)0x73656963696c6f70;
  local_6c8._8_8_ = local_720;
  *(char *)(local_6c8._0_8_ + (long)local_720) = '\0';
  ptVar21 = VW::config::options_i::get_typed_option<unsigned_int>(this,(string *)local_6c8);
  VW::config::typed_option<unsigned_int>::value(ptVar21,*local_6d0);
  if ((undefined1 *)local_6c8._0_8_ != local_6b8) {
    operator_delete((void *)local_6c8._0_8_);
  }
  iVar11 = std::__cxx11::string::compare((char *)&local_4b8);
  if (iVar11 == 0) {
    poVar23 = std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar23,"available search tasks:",0x17);
    std::endl<char,std::char_traits<char>>(poVar23);
    if (all_tasks != (undefined *)0x0) {
      ppuVar20 = &PTR_task_002dab68;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"  ",2);
        poVar23 = std::operator<<((ostream *)&std::cerr,*(char **)ppuVar20[-1]);
        std::endl<char,std::char_traits<char>>(poVar23);
        puVar3 = *ppuVar20;
        ppuVar20 = ppuVar20 + 1;
      } while (puVar3 != (undefined *)0x0);
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  }
  else {
    iVar11 = std::__cxx11::string::compare((char *)&local_458);
    if (iVar11 != 0) {
      if (all_tasks != (undefined *)0x0) {
        ppuVar20 = &PTR_task_002dab68;
        do {
          iVar11 = std::__cxx11::string::compare((char *)&local_4b8);
          if (iVar11 == 0) {
            psVar4 = (search_task *)ppuVar20[-1];
            psVar14->task = psVar4;
            local_6d8->task_name = psVar4->task_name;
            break;
          }
          puVar3 = *ppuVar20;
          ppuVar20 = ppuVar20 + 1;
        } while (puVar3 != (undefined *)0x0);
      }
      if (psVar14->task == (search_task *)0x0) {
        local_6b8._0_2_ = 0x6568;
        local_6b8[2] = 'l';
        local_6b8[3] = 'p';
        local_6c8._8_8_ = (undefined8 **)0x4;
        local_6b8[4] = '\0';
        local_6c8._0_8_ = local_6b8;
        iVar11 = (*poVar28->_vptr_options_i[1])(poVar28);
        if ((undefined1 *)local_6c8._0_8_ != local_6b8) {
          operator_delete((void *)local_6c8._0_8_);
        }
        if ((char)iVar11 == '\0') {
          std::__cxx11::stringstream::stringstream((stringstream *)local_6c8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_6b8,"fail: unknown task for --search_task \'",0x26);
          poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_6b8,local_4b8._M_dataplus._M_p,
                               local_4b8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar23,"\'; use --search_task list to get a list",0x27);
          pvVar18 = (vw_exception *)__cxa_allocate_exception(0x38);
          std::__cxx11::stringbuf::str();
          VW::vw_exception::vw_exception
                    (pvVar18,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/search.cc"
                     ,0xb35,&local_d0);
          __cxa_throw(pvVar18,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
        }
      }
      psVar14->metatask = (search_metatask *)0x0;
      if (all_metatasks != (undefined *)0x0) {
        ppuVar20 = &PTR_metatask_002dabc8;
        do {
          iVar11 = std::__cxx11::string::compare((char *)&local_458);
          if (iVar11 == 0) {
            psVar5 = (search_metatask *)ppuVar20[-1];
            psVar14->metatask = psVar5;
            local_6d8->metatask_name = psVar5->metatask_name;
            break;
          }
          puVar3 = *ppuVar20;
          ppuVar20 = ppuVar20 + 1;
        } while (puVar3 != (undefined *)0x0);
      }
      all_00->p->emptylines_separate_examples = true;
      local_6b8._0_2_ = 0x7363;
      local_6b8[2] = 'o';
      local_6b8[3] = 'a';
      local_6b8[4] = 'a';
      local_6b8[5] = '\0';
      local_6c8._8_8_ = (pointer)0x5;
      local_6c8._0_8_ = local_6b8;
      iVar11 = (*poVar28->_vptr_options_i[1])(poVar28);
      if ((char)iVar11 == '\0') {
        local_720 = &local_710;
        local_710 = (undefined8 *)0x76697463615f7363;
        local_708 = 0x65;
        local_718 = (undefined8 *)0x9;
        iVar11 = (*poVar28->_vptr_options_i[1])(poVar28);
        if ((char)iVar11 == '\0') {
          local_6f0 = 0x646c5f61616f7363;
          local_6e8 = 0x66;
          local_6f8 = 9;
          local_700 = &local_6f0;
          iVar11 = (*poVar28->_vptr_options_i[1])(poVar28,&local_700);
          if ((char)iVar11 == '\0') {
            local_200 = 0x5f706177;
            uStack_1fc = 0x66646c;
            local_208 = 7;
            local_1f9 = 0;
            local_210 = &local_200;
            iVar11 = (*poVar28->_vptr_options_i[1])(poVar28,&local_210);
            if ((char)iVar11 == '\0') {
              local_3f0 = &local_3e0;
              local_3e0 = 0x6263;
              local_3e8 = 2;
              local_3de = 0;
              iVar11 = (*local_6e0->_vptr_options_i[1])(local_6e0,&local_3f0);
              if (local_3f0 != &local_3e0) {
                operator_delete(local_3f0);
              }
              bVar30 = (byte)iVar11 ^ 1;
            }
            else {
              bVar30 = 0;
            }
            poVar28 = local_6e0;
            if (local_210 != &local_200) {
              operator_delete(local_210);
              poVar28 = local_6e0;
            }
          }
          else {
            bVar30 = 0;
          }
          if (local_700 != &local_6f0) {
            operator_delete(local_700);
          }
        }
        else {
          bVar30 = 0;
        }
        if (local_720 != &local_710) {
          operator_delete(local_720);
        }
      }
      else {
        bVar30 = 0;
      }
      if ((undefined1 *)local_6c8._0_8_ != local_6b8) {
        operator_delete((void *)local_6c8._0_8_);
      }
      psVar13 = local_6d8;
      if (bVar30 != 0) {
        local_6b8._0_2_ = 0x7363;
        local_6b8[2] = 'o';
        local_6b8[3] = 'a';
        local_6b8[4] = 'a';
        local_6b8[5] = '\0';
        local_6c8._8_8_ = (pointer)0x5;
        __val = *local_540;
        cVar10 = '\x01';
        if (9 < __val) {
          uVar24 = __val;
          cVar9 = '\x04';
          do {
            cVar10 = cVar9;
            if (uVar24 < 100) {
              cVar10 = cVar10 + -2;
              goto LAB_0025e9f3;
            }
            if (uVar24 < 1000) {
              cVar10 = cVar10 + -1;
              goto LAB_0025e9f3;
            }
            if (uVar24 < 10000) goto LAB_0025e9f3;
            bVar7 = 99999 < uVar24;
            uVar24 = uVar24 / 10000;
            cVar9 = cVar10 + '\x04';
          } while (bVar7);
          cVar10 = cVar10 + '\x01';
        }
LAB_0025e9f3:
        local_720 = &local_710;
        local_6c8._0_8_ = local_6b8;
        std::__cxx11::string::_M_construct((ulong)&local_720,cVar10);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_720,(uint)local_718,__val);
        (*poVar28->_vptr_options_i[5])(poVar28,local_6c8,&local_720);
        psVar13 = local_6d8;
        if (local_720 != &local_710) {
          operator_delete(local_720);
        }
        if ((undefined1 *)local_6c8._0_8_ != local_6b8) {
          operator_delete((void *)local_6c8._0_8_);
        }
      }
      local_6b8._0_2_ = 0x7363;
      local_6b8[2] = '_';
      local_6b8[3] = 'a';
      local_6b8[4] = 'c';
      local_6b8[5] = 't';
      local_6b8[6] = 'i';
      local_6b8[7] = 'v';
      local_6b8._8_2_ = 0x65;
      local_6c8._8_8_ = (pointer)0x9;
      local_6c8._0_8_ = local_6b8;
      iVar11 = (*poVar28->_vptr_options_i[1])(poVar28);
      psVar14->active_csoaa = SUB41(iVar11,0);
      if ((undefined1 *)local_6c8._0_8_ != local_6b8) {
        operator_delete((void *)local_6c8._0_8_);
      }
      *local_498 = -1.0;
      local_720 = (undefined8 **)0x14;
      local_6c8._0_8_ = local_6b8;
      local_6c8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_6c8,(ulong)&local_720);
      local_6b8._0_2_ = SUB82(local_720,0);
      local_6b8[2] = (undefined1)((ulong)local_720 >> 0x10);
      local_6b8[3] = (undefined1)((ulong)local_720 >> 0x18);
      local_6b8[4] = (undefined1)((ulong)local_720 >> 0x20);
      local_6b8[5] = (undefined1)((ulong)local_720 >> 0x28);
      local_6b8[6] = (undefined1)((ulong)local_720 >> 0x30);
      local_6b8[7] = (undefined1)((ulong)local_720 >> 0x38);
      *(undefined4 *)local_6c8._0_8_ = 0x72616573;
      builtin_strncpy((char *)(local_6c8._0_8_ + 4),"ch_a",4);
      *(undefined4 *)(local_6c8._0_8_ + 8) = 0x76697463;
      builtin_strncpy((char *)(local_6c8._0_8_ + 0xc),"e_ve",4);
      *(undefined4 *)(local_6c8._0_8_ + 0x10) = 0x79666972;
      local_6c8._8_8_ = local_720;
      *(char *)(local_6c8._0_8_ + (long)local_720) = '\0';
      iVar11 = (*poVar28->_vptr_options_i[1])(poVar28);
      if ((undefined1 *)local_6c8._0_8_ != local_6b8) {
        operator_delete((void *)local_6c8._0_8_);
      }
      if (((char)iVar11 != '\0') && (psVar14->active_csoaa == false)) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_6c8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_6b8,
                   "cannot use --search_active_verify without using --cs_active",0x3b);
        pvVar18 = (vw_exception *)__cxa_allocate_exception(0x38);
        std::__cxx11::stringbuf::str();
        VW::vw_exception::vw_exception
                  (pvVar18,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/search.cc"
                   ,0xb4b,&local_f0);
        __cxa_throw(pvVar18,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
      __src = setup_base(all_00->options,all_00);
      ppuVar20 = &MULTICLASS::mc_label;
      plVar29 = &all_00->p->lp;
      for (lVar25 = 9; lVar25 != 0; lVar25 = lVar25 + -1) {
        plVar29->default_label = (_func_void_void_ptr *)*ppuVar20;
        ppuVar20 = ppuVar20 + (ulong)bVar31 * -2 + 1;
        plVar29 = (label_parser *)((long)plVar29 + (ulong)bVar31 * -0x10 + 8);
      }
      all_00->label_type = mc;
      if ((psVar14->task != (search_task *)0x0) &&
         (p_Var6 = psVar14->task->initialize,
         p_Var6 != (_func_void_search_ptr_size_t_ptr_options_i_ptr *)0x0)) {
        (*p_Var6)(psVar13,local_540,local_6e0);
      }
      if ((psVar14->metatask != (search_metatask *)0x0) &&
         (p_Var6 = psVar14->metatask->initialize,
         p_Var6 != (_func_void_search_ptr_size_t_ptr_options_i_ptr *)0x0)) {
        (*p_Var6)(psVar13,local_540,local_6e0);
      }
      psVar14->meta_t = 0;
      local_720 = (undefined8 **)0x1a;
      local_6c8._0_8_ = local_6b8;
      local_6c8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_6c8,(ulong)&local_720);
      local_6b8._0_2_ = SUB82(local_720,0);
      local_6b8[2] = (undefined1)((ulong)local_720 >> 0x10);
      local_6b8[3] = (undefined1)((ulong)local_720 >> 0x18);
      local_6b8[4] = (undefined1)((ulong)local_720 >> 0x20);
      local_6b8[5] = (undefined1)((ulong)local_720 >> 0x28);
      local_6b8[6] = (undefined1)((ulong)local_720 >> 0x30);
      local_6b8[7] = (undefined1)((ulong)local_720 >> 0x38);
      builtin_strncpy((char *)(local_6c8._0_8_ + 10),"owed_tra",8);
      builtin_strncpy((char *)(local_6c8._0_8_ + 0x12),"nsitions",8);
      *(undefined4 *)local_6c8._0_8_ = 0x72616573;
      builtin_strncpy((char *)(local_6c8._0_8_ + 4),"ch_a",4);
      *(undefined4 *)(local_6c8._0_8_ + 8) = 0x776f6c6c;
      builtin_strncpy((char *)(local_6c8._0_8_ + 0xc),"ed_t",4);
      local_6c8._8_8_ = local_720;
      *(char *)(local_6c8._0_8_ + (long)local_720) = '\0';
      iVar11 = (*local_6e0->_vptr_options_i[1])();
      if ((undefined1 *)local_6c8._0_8_ != local_6b8) {
        operator_delete((void *)local_6c8._0_8_);
      }
      if ((char)iVar11 != '\0') {
        read_allowed_transitions
                  ((v_array<COST_SENSITIVE::label> *)local_6c8,(action)*local_540,
                   local_430._M_dataplus._M_p);
      }
      handle_condition_options(all_00,&psVar14->acset);
      if (psVar14->allow_current_policy == false) {
        all_00->check_holdout_every_n_passes = *local_4c0;
      }
      all_00->searchstr = psVar13;
      cVar22 = clock();
      psVar14->start_clock_time = cVar22;
      sVar27 = psVar14->num_learners;
      if (psVar14->xv == true) {
        sVar27 = sVar27 * 3;
        psVar14->num_learners = sVar27;
      }
      uVar1 = *local_6d0;
      uVar2 = *(undefined4 *)(__src + 0xd0);
      __dest = calloc_or_throw<LEARNER::learner<Search::search,std::vector<example*,std::allocator<example*>>>>
                         (1);
      memcpy(__dest,__src,0xe9);
      *(base_learner **)(__dest + 0x20) = __src;
      *(code **)(__dest + 0x50) = LEARNER::recur_sensitivity;
      *(search **)(__dest + 0xb8) = psVar13;
      *(base_learner **)(__dest + 0xc0) = __src;
      *(code **)(__dest + 200) = LEARNER::noop;
      *(size_t *)(__dest + 0xd8) = sVar27 * uVar1;
      *(size_t *)(__dest + 0xe0) = sVar27 * uVar1 * *(long *)(__src + 0xe0);
      *(search **)(__dest + 0x18) = psVar13;
      *(code **)(__dest + 0x28) = do_actual_learning<true>;
      *(code **)(__dest + 0x38) = do_actual_learning<true>;
      *(code **)(__dest + 0x30) = do_actual_learning<false>;
      *(undefined8 *)(__dest + 0x40) = 0;
      *(undefined4 *)(__dest + 0xd0) = uVar2;
      __dest[0xe8] = (learner<Search::search,_std::vector<example_*,_std::allocator<example_*>_>_>)
                     0x1;
      *(search **)(__dest + 0x58) = psVar13;
      *(code **)(__dest + 0x68) = finish_multiline_example;
      *(search **)(__dest + 0xa0) = psVar13;
      *(base_learner **)(__dest + 0xa8) = __src;
      *(code **)(__dest + 0xb0) = end_examples;
      *(search **)(__dest + 0xb8) = psVar13;
      *(base_learner **)(__dest + 0xc0) = __src;
      *(code **)(__dest + 200) = search_finish;
      *(search **)(__dest + 0x88) = psVar13;
      *(base_learner **)(__dest + 0x90) = __src;
      *(code **)(__dest + 0x98) = end_pass;
      psVar13 = (search *)0x0;
      goto LAB_0025ed95;
    }
    poVar23 = std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar23,"available search metatasks:",0x1b);
    std::endl<char,std::char_traits<char>>(poVar23);
    if (all_metatasks != (undefined *)0x0) {
      ppuVar20 = &PTR_metatask_002dabc8;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"  ",2);
        poVar23 = std::operator<<((ostream *)&std::cerr,*(char **)ppuVar20[-1]);
        std::endl<char,std::char_traits<char>>(poVar23);
        puVar3 = *ppuVar20;
        ppuVar20 = ppuVar20 + 1;
      } while (puVar3 != (undefined *)0x0);
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  }
  exit(0);
}

Assistant:

base_learner* setup(options_i& options, vw& all)
{
  free_ptr<search> sch = scoped_calloc_or_throw<search>();
  search_private& priv = *sch->priv;
  std::string task_string;
  std::string metatask_string;
  std::string interpolation_string = "data";
  std::string neighbor_features_string;
  std::string rollout_string = "mix_per_state";
  std::string rollin_string = "mix_per_state";

  uint32_t search_trained_nb_policies;
  std::string search_allowed_transitions;

  priv.A = 1;
  option_group_definition new_options("Search options");
  new_options.add(
      make_option("search", priv.A).keep().help("Use learning to search, argument=maximum action id or 0 for LDF"));
  new_options.add(make_option("search_task", task_string)
                      .keep()
                      .help("the search task (use \"--search_task list\" to get a list of available tasks)"));
  new_options.add(
      make_option("search_metatask", metatask_string)
          .keep()
          .help("the search metatask (use \"--search_metatask list\" to get a list of available metatasks)"));
  new_options.add(make_option("search_interpolation", interpolation_string)
                      .keep()
                      .help("at what level should interpolation happen? [*data|policy]"));
  new_options.add(
      make_option("search_rollout", rollout_string)
          .help("how should rollouts be executed?           [policy|oracle|*mix_per_state|mix_per_roll|none]"));
  new_options.add(make_option("search_rollin", rollin_string)
                      .help("how should past trajectories be generated? [policy|oracle|*mix_per_state|mix_per_roll]"));
  new_options.add(make_option("search_passes_per_policy", priv.passes_per_policy)
                      .default_value(1)
                      .help("number of passes per policy (only valid for search_interpolation=policy)"));
  new_options.add(make_option("search_beta", priv.beta)
                      .default_value(0.5f)
                      .help("interpolation rate for policies (only valid for search_interpolation=policy)"));
  new_options.add(make_option("search_alpha", priv.alpha)
                      .default_value(1e-10f)
                      .help("annealed beta = 1-(1-alpha)^t (only valid for search_interpolation=data)"));
  new_options.add(make_option("search_total_nb_policies", priv.total_number_of_policies)
                      .help("if we are going to train the policies through multiple separate calls to vw, we need to "
                            "specify this parameter and tell vw how many policies are eventually going to be trained"));
  new_options.add(make_option("search_trained_nb_policies", search_trained_nb_policies)
                      .help("the number of trained policies in a file"));
  new_options.add(make_option("search_allowed_transitions", search_allowed_transitions)
                      .help("read file of allowed transitions [def: all transitions are allowed]"));
  new_options.add(make_option("search_subsample_time", priv.subsample_timesteps)
                      .help("instead of training at all timesteps, use a subset. if value in (0,1), train on a random "
                            "v%. if v>=1, train on precisely v steps per example, if v<=-1, use active learning"));
  new_options.add(
      make_option("search_neighbor_features", neighbor_features_string)
          .keep()
          .help("copy features from neighboring lines. argument looks like: '-1:a,+2' meaning copy previous line "
                "namespace a and next next line from namespace _unnamed_, where ',' separates them"));
  new_options.add(make_option("search_rollout_num_steps", priv.rollout_num_steps)
                      .help("how many calls of \"loss\" before we stop really predicting on rollouts and switch to "
                            "oracle (default means \"infinite\")"));
  new_options.add(make_option("search_history_length", priv.history_length)
                      .keep()
                      .default_value(1)
                      .help("some tasks allow you to specify how much history their depend on; specify that here"));
  new_options.add(make_option("search_no_caching", priv.no_caching)
                      .help("turn off the built-in caching ability (makes things slower, but technically more safe)"));
  new_options.add(
      make_option("search_xv", priv.xv).help("train two separate policies, alternating prediction/learning"));
  new_options.add(make_option("search_perturb_oracle", priv.perturb_oracle)
                      .default_value(0.f)
                      .help("perturb the oracle on rollin with this probability"));
  new_options.add(make_option("search_linear_ordering", priv.linear_ordering)
                      .help("insist on generating examples in linear order (def: hoopla permutation)"));
  new_options.add(make_option("search_active_verify", priv.active_csoaa_verify)
                      .help("verify that active learning is doing the right thing (arg = multiplier, should be = "
                            "cost_range * range_c)"));
  new_options.add(make_option("search_save_every_k_runs", priv.save_every_k_runs).help("save model every k runs"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("search_task"))
    return nullptr;

  search_initialize(&all, *sch.get());

  parse_neighbor_features(neighbor_features_string, *sch.get());

  if (interpolation_string.compare("data") == 0)  // run as dagger
  {
    priv.adaptive_beta = true;
    priv.allow_current_policy = true;
    priv.passes_per_policy = all.numpasses;
    if (priv.current_policy > 1)
      priv.current_policy = 1;
  }
  else if (interpolation_string.compare("policy") == 0)
    ;
  else
    THROW("error: --search_interpolation must be 'data' or 'policy'");

  if ((rollout_string.compare("policy") == 0) || (rollout_string.compare("learn") == 0))
    priv.rollout_method = POLICY;
  else if ((rollout_string.compare("oracle") == 0) || (rollout_string.compare("ref") == 0))
    priv.rollout_method = ORACLE;
  else if ((rollout_string.compare("mix_per_state") == 0))
    priv.rollout_method = MIX_PER_STATE;
  else if ((rollout_string.compare("mix_per_roll") == 0) || (rollout_string.compare("mix") == 0))
    priv.rollout_method = MIX_PER_ROLL;
  else if ((rollout_string.compare("none") == 0))
  {
    priv.rollout_method = NO_ROLLOUT;
    priv.no_caching = true;
  }
  else
    THROW("error: --search_rollout must be 'learn', 'ref', 'mix', 'mix_per_state' or 'none'");

  if ((rollin_string.compare("policy") == 0) || (rollin_string.compare("learn") == 0))
    priv.rollin_method = POLICY;
  else if ((rollin_string.compare("oracle") == 0) || (rollin_string.compare("ref") == 0))
    priv.rollin_method = ORACLE;
  else if ((rollin_string.compare("mix_per_state") == 0))
    priv.rollin_method = MIX_PER_STATE;
  else if ((rollin_string.compare("mix_per_roll") == 0) || (rollin_string.compare("mix") == 0))
    priv.rollin_method = MIX_PER_ROLL;
  else
    THROW("error: --search_rollin must be 'learn', 'ref', 'mix' or 'mix_per_state'");

  // check if the base learner is contextual bandit, in which case, we dont rollout all actions.
  priv.allowed_actions_cache = &calloc_or_throw<polylabel>();
  if (options.was_supplied("cb"))
  {
    priv.cb_learner = true;
    CB::cb_label.default_label(priv.allowed_actions_cache);
    priv.learn_losses.cb.costs = v_init<CB::cb_class>();
    priv.gte_label.cb.costs = v_init<CB::cb_class>();
  }
  else
  {
    priv.cb_learner = false;
    CS::cs_label.default_label(priv.allowed_actions_cache);
    priv.learn_losses.cs.costs = v_init<CS::wclass>();
    priv.gte_label.cs.costs = v_init<CS::wclass>();
  }

  ensure_param(priv.beta, 0.0, 1.0, 0.5, "warning: search_beta must be in (0,1); resetting to 0.5");
  ensure_param(priv.alpha, 0.0, 1.0, 1e-10f, "warning: search_alpha must be in (0,1); resetting to 1e-10");

  priv.num_calls_to_run = 0;

  // compute total number of policies we will have at end of training
  // we add current_policy for cases where we start from an initial set of policies loaded through -i option
  uint32_t tmp_number_of_policies = priv.current_policy;
  if (all.training)
    tmp_number_of_policies += (int)ceil(((float)all.numpasses) / ((float)priv.passes_per_policy));

  // the user might have specified the number of policies that will eventually be trained through multiple vw calls,
  // so only set total_number_of_policies to computed value if it is larger
  cdbg << "current_policy=" << priv.current_policy << " tmp_number_of_policies=" << tmp_number_of_policies
       << " total_number_of_policies=" << priv.total_number_of_policies << endl;
  if (tmp_number_of_policies > priv.total_number_of_policies)
  {
    priv.total_number_of_policies = tmp_number_of_policies;
    if (priv.current_policy >
        0)  // we loaded a file but total number of policies didn't match what is needed for training
      std::cerr << "warning: you're attempting to train more classifiers than was allocated initially. Likely to cause "
                   "bad performance."
                << endl;
  }

  // current policy currently points to a new policy we would train
  // if we are not training and loaded a bunch of policies for testing, we need to subtract 1 from current policy
  // so that we only use those loaded when testing (as run_prediction is called with allow_current to true)
  if (!all.training && priv.current_policy > 0)
    priv.current_policy--;

  all.options->replace("search_trained_nb_policies", std::to_string(priv.current_policy));
  all.options->get_typed_option<uint32_t>("search_trained_nb_policies").value(priv.current_policy);

  all.options->replace("search_total_nb_policies", std::to_string(priv.total_number_of_policies));
  all.options->get_typed_option<uint32_t>("search_total_nb_policies").value(priv.total_number_of_policies);

  cdbg << "search current_policy = " << priv.current_policy
       << " total_number_of_policies = " << priv.total_number_of_policies << endl;

  if (task_string.compare("list") == 0)
  {
    std::cerr << endl << "available search tasks:" << endl;
    for (search_task** mytask = all_tasks; *mytask != nullptr; mytask++)
      std::cerr << "  " << (*mytask)->task_name << endl;
    std::cerr << endl;
    exit(0);
  }
  if (metatask_string.compare("list") == 0)
  {
    std::cerr << endl << "available search metatasks:" << endl;
    for (search_metatask** mytask = all_metatasks; *mytask != nullptr; mytask++)
      std::cerr << "  " << (*mytask)->metatask_name << endl;
    std::cerr << endl;
    exit(0);
  }
  for (search_task** mytask = all_tasks; *mytask != nullptr; mytask++)
    if (task_string.compare((*mytask)->task_name) == 0)
    {
      priv.task = *mytask;
      sch->task_name = (*mytask)->task_name;
      break;
    }
  if (priv.task == nullptr)
  {
    if (!options.was_supplied("help"))
      THROW("fail: unknown task for --search_task '" << task_string << "'; use --search_task list to get a list");
  }
  priv.metatask = nullptr;
  for (search_metatask** mytask = all_metatasks; *mytask != nullptr; mytask++)
    if (metatask_string.compare((*mytask)->metatask_name) == 0)
    {
      priv.metatask = *mytask;
      sch->metatask_name = (*mytask)->metatask_name;
      break;
    }
  all.p->emptylines_separate_examples = true;

  if (!options.was_supplied("csoaa") && !options.was_supplied("cs_active") && !options.was_supplied("csoaa_ldf") &&
      !options.was_supplied("wap_ldf") && !options.was_supplied("cb"))
  {
    options.insert("csoaa", std::to_string(priv.A));
  }

  priv.active_csoaa = options.was_supplied("cs_active");
  priv.active_csoaa_verify = -1.;
  if (options.was_supplied("search_active_verify"))
    if (!priv.active_csoaa)
      THROW("cannot use --search_active_verify without using --cs_active");

  cdbg << "active_csoaa = " << priv.active_csoaa << ", active_csoaa_verify = " << priv.active_csoaa_verify << endl;

  base_learner* base = setup_base(*all.options, all);

  // default to OAA labels unless the task wants to override this (which they can do in initialize)
  all.p->lp = MC::mc_label;
  all.label_type = label_type::mc;
  if (priv.task && priv.task->initialize)
    priv.task->initialize(*sch.get(), priv.A, options);
  if (priv.metatask && priv.metatask->initialize)
    priv.metatask->initialize(*sch.get(), priv.A, options);
  priv.meta_t = 0;

  if (options.was_supplied("search_allowed_transitions"))
    read_allowed_transitions((action)priv.A, search_allowed_transitions.c_str());

  // set up auto-history (used to only do this if AUTO_CONDITION_FEATURES was on, but that doesn't work for hooktask)
  handle_condition_options(all, priv.acset);

  if (!priv.allow_current_policy)  // if we're not dagger
    all.check_holdout_every_n_passes = priv.passes_per_policy;

  all.searchstr = sch.get();

  priv.start_clock_time = clock();

  if (priv.xv)
    priv.num_learners *= 3;

  cdbg << "num_learners = " << priv.num_learners << endl;

  learner<search, multi_ex>& l = init_learner(sch, make_base(*base), do_actual_learning<true>,
      do_actual_learning<false>, priv.total_number_of_policies * priv.num_learners);
  l.set_finish_example(finish_multiline_example);
  l.set_end_examples(end_examples);
  l.set_finish(search_finish);
  l.set_end_pass(end_pass);
  return make_base(l);
}